

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcBindModuleFunctionWrapper
                  (char *module,void *func,_func_void_void_ptr_char_ptr_char_ptr *ptr,char *name,
                  int index)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  TraceScope traceScope;
  char *errorPos;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    bVar4 = false;
  }
  else {
    if (nullcBindModuleFunctionWrapper::token == '\0') {
      iVar5 = __cxa_guard_acquire(&nullcBindModuleFunctionWrapper::token);
      if (iVar5 != 0) {
        nullcBindModuleFunctionWrapper::token =
             NULLC::TraceGetToken("nullc","nullcBindModuleFunctionWrapper");
        __cxa_guard_release(&nullcBindModuleFunctionWrapper::token);
      }
    }
    NULLC::TraceScope::TraceScope(&traceScope,nullcBindModuleFunctionWrapper::token);
    lVar3 = NULLC::traceContext;
    sVar6 = strlen(module);
    uVar7 = (int)sVar6 + 1;
    if ((*(uint *)(lVar3 + 0x264) <= *(int *)(lVar3 + 0x260) + uVar7) ||
       (*(int *)(lVar3 + 0x270) == *(int *)(lVar3 + 0x274))) {
      NULLC::TraceDump();
    }
    if (*(uint *)(lVar3 + 0x264) <= uVar7) {
      __assert_fail("count < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x127,"void NULLC::TraceLabel(const char *)");
    }
    uVar1 = *(uint *)(lVar3 + 0x260);
    memcpy((void *)((ulong)uVar1 + *(long *)(lVar3 + 0x268)),module,(ulong)uVar7);
    *(int *)(lVar3 + 0x260) = *(int *)(lVar3 + 0x260) + uVar7;
    lVar2 = *(long *)(lVar3 + 0x278);
    uVar7 = *(uint *)(lVar3 + 0x270);
    *(uint *)(lVar3 + 0x270) = uVar7 + 1;
    *(uint *)(lVar2 + (ulong)uVar7 * 8) = uVar1 * 4 + 2;
    *(undefined4 *)(lVar2 + 4 + (ulong)uVar7 * 8) = 0;
    if (NULLC::compilerCtx != 0) {
      __assert_fail("!compilerCtx",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/nullc.cpp"
                    ,0x134,
                    "nullres nullcBindModuleFunctionWrapper(const char *, void *, void (*)(void *, char *, char *), const char *, int)"
                   );
    }
    if (func == (void *)0x0) {
      __assert_fail("func",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/nullc.cpp"
                    ,0x136,
                    "nullres nullcBindModuleFunctionWrapper(const char *, void *, void (*)(void *, char *, char *), const char *, int)"
                   );
    }
    errorPos = (char *)0x0;
    bVar4 = AddModuleFunction((Allocator *)NULLC::allocator,module,(_func_void *)0x0,func,ptr,name,
                              index,&errorPos,NULLC::errorBuf,0x10000,NULLC::optimizationLevel);
    if (!bVar4) {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
      NULLC::nullcLastError = NULLC::errorBuf;
    }
    else {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    }
    bVar4 = bVar4;
    NULLC::TraceScope::~TraceScope(&traceScope);
  }
  return bVar4;
}

Assistant:

nullres nullcBindModuleFunctionWrapper(const char* module, void *func, void (*ptr)(void *func, char* retBuf, char* argBuf), const char* name, int index)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcBindModuleFunctionWrapper");
	TRACE_LABEL(module);

	assert(!compilerCtx);

	assert(func);

	const char *errorPos = NULL;

	if(!AddModuleFunction(&allocator, module, NULL, func, ptr, name, index, &errorPos, errorBuf, NULLC_ERROR_BUFFER_SIZE, NULLC::optimizationLevel))
	{
		allocator.Clear();

		nullcLastError = errorBuf;

		return false;
	}

	allocator.Clear();

	return true;
}